

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

void Dtc_ObjCleanTruth_rec(Gia_Obj_t *pObj)

{
  uint uVar1;
  
  while( true ) {
    if (pObj->Value == 0) {
      return;
    }
    pObj->Value = 0;
    if ((int)(uint)*(undefined8 *)pObj < 0) break;
    uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff;
    if (uVar1 == 0x1fffffff) {
      return;
    }
    Dtc_ObjCleanTruth_rec(pObj + -(ulong)uVar1);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  return;
}

Assistant:

void Dtc_ObjCleanTruth_rec( Gia_Obj_t * pObj )
{
    if ( !pObj->Value )
        return;
    pObj->Value = 0;
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Dtc_ObjCleanTruth_rec( Gia_ObjFanin0(pObj) );
    Dtc_ObjCleanTruth_rec( Gia_ObjFanin1(pObj) );
}